

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O0

void __thiscall
ddd::DictionaryMLT<true,_true>::DictionaryMLT(DictionaryMLT<false,_false> *this,istream *is)

{
  Dictionary *in_RDI;
  bool has_trie;
  size_t i;
  size_t num_suffixes;
  istream *is_00;
  unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  *this_00;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  istream local_18 [24];
  
  Dictionary::Dictionary(in_RDI);
  in_RDI->_vptr_Dictionary = (_func_int **)&PTR__DictionaryMLT_001b4ca8;
  this_00 = (unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
             *)(in_RDI + 1);
  std::unique_ptr<ddd::DaTrie<true,true,true>,std::default_delete<ddd::DaTrie<true,true,true>>>::
  unique_ptr<std::default_delete<ddd::DaTrie<true,true,true>>,void>(this_00);
  in_RDI[2]._vptr_Dictionary = (_func_int **)0x0;
  in_RDI[3]._vptr_Dictionary = (_func_int **)0x0;
  in_RDI[4]._vptr_Dictionary = (_func_int **)0x0;
  std::
  vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
  ::vector((vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
            *)0x193eff);
  *(undefined4 *)&in_RDI[5]._vptr_Dictionary = 0xffffffff;
  in_RDI[6]._vptr_Dictionary = (_func_int **)0x0;
  make_unique<ddd::DaTrie<true,true,true>,std::istream&>(in_stack_ffffffffffffffb8);
  is_00 = local_18;
  std::
  unique_ptr<ddd::DaTrie<true,_true,_true>,_std::default_delete<ddd::DaTrie<true,_true,_true>_>_>::
  operator=(this_00,(unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                     *)is_00);
  std::
  unique_ptr<ddd::DaTrie<true,_true,_true>,_std::default_delete<ddd::DaTrie<true,_true,_true>_>_>::
  ~unique_ptr(this_00);
  utils::read_value<unsigned_long>((unsigned_long *)this_00,is_00);
  std::
  vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
  ::resize((vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
            *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
           (size_type)in_stack_ffffffffffffffb8);
  utils::read_value<unsigned_int>((uint *)this_00,is_00);
  utils::read_value<unsigned_long>((unsigned_long *)this_00,is_00);
  return;
}

Assistant:

DictionaryMLT(std::istream& is) {
    prefix_subtrie_ = make_unique<PrefixTrieType>(is);
    size_t num_suffixes = 0;
    utils::read_value(num_suffixes, is);
    suffix_subtries_.resize(num_suffixes);
    for (size_t i = 0; i < num_suffixes; ++i) {
      bool has_trie{};
      utils::read_value(has_trie, is);
      if (has_trie) {
        suffix_subtries_[i] = make_unique<SuffixTrieType>(is);
      }
    }
    utils::read_value(suffix_head_, is);
    utils::read_value(num_keys_, is);
  }